

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

void __thiscall FDecalLib::ParseDecalGroup(FDecalLib *this,FScanner *sc)

{
  char *name;
  bool bVar1;
  WORD WVar2;
  int iVar3;
  FDecalBase *value;
  FDecalLib *this_00;
  FDecalBase *this_01;
  FString groupName;
  FDecalLib local_40;
  
  local_40.Root = (FDecalBase *)FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  this_00 = &local_40;
  FString::operator=((FString *)this_00,sc->String);
  WVar2 = GetDecalID(this_00,sc);
  FScanner::MustGetStringName(sc,"{");
  local_40.Translations = (FTranslation *)operator_new(0x40);
  (((FDecalBase *)local_40.Translations)->Users).Array = (PClass **)0x0;
  (((FDecalBase *)local_40.Translations)->Users).Most = 0;
  (((FDecalBase *)local_40.Translations)->Users).Count = 0;
  (((FDecalBase *)local_40.Translations)->Name).Index = 0;
  ((FDecalBase *)local_40.Translations)->_vptr_FDecalBase = (_func_int **)&PTR_GetDecal_0086ce58;
  this_01 = (FDecalBase *)((long)local_40.Translations + 0x30);
  ((FDecalBase *)((long)local_40.Translations + 0x30))->_vptr_FDecalBase = (_func_int **)0x0;
  ((FDecalBase *)((long)local_40.Translations + 0x30))->Left = (FDecalBase *)&pr_decalchoice;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    name = sc->String;
    value = ScanTreeForName(name,this->Root);
    if (value == (FDecalBase *)0x0) {
      FScanner::ScriptError(sc,"%s has not been defined",name);
    }
    FScanner::MustGetNumber(sc);
    TWeightedList<FDecalBase_*>::AddEntry
              ((TWeightedList<FDecalBase_*> *)this_01,value,(WORD)sc->Number);
  }
  iVar3 = FName::NameManager::FindName
                    (&FName::NameData,(char *)local_40.Root,
                     (ulong)*(uint *)((long)&local_40.Root[-1].Users.Array + 4),false);
  ((FName *)((long)local_40.Translations + 0x18))->Index = iVar3;
  *(WORD *)((long)local_40.Translations + 0x1c) = WVar2;
  AddDecal(this,(FDecalBase *)local_40.Translations);
  FString::~FString((FString *)&local_40);
  return;
}

Assistant:

void FDecalLib::ParseDecalGroup (FScanner &sc)
{
	FString groupName;
	WORD decalNum;
	FDecalBase *targetDecal;
	FDecalGroup *group;

	sc.MustGetString ();
	groupName = sc.String;
	decalNum = GetDecalID (sc);
	sc.MustGetStringName ("{");

	group = new FDecalGroup;

	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			group->Name = groupName;
			group->SpawnID = decalNum;
			AddDecal (group);
			break;
		}

		targetDecal = ScanTreeForName (sc.String, Root);
		if (targetDecal == NULL)
		{
			sc.ScriptError ("%s has not been defined", sc.String);
		}
		sc.MustGetNumber ();

		group->AddDecal (targetDecal, sc.Number);
	}
}